

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

char * Acb_Oper2Name(int i)

{
  switch(i) {
  case 7:
    return "const0";
  case 8:
    return "const1";
  case 9:
    return "constX";
  case 10:
  case 0x13:
  case 0x14:
    goto switchD_00327ee1_caseD_3;
  case 0xb:
    return "buf";
  case 0xc:
    return "not";
  case 0xd:
    return "and";
  case 0xe:
    return "nand";
  case 0xf:
    return "or";
  case 0x10:
    return "nor";
  case 0x11:
    return "xor";
  case 0x12:
    return "xnor";
  case 0x15:
    return "mux";
  default:
    if (i == 0x4e) {
      return "_DC";
    }
switchD_00327ee1_caseD_3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                  ,0x6d,"char *Acb_Oper2Name(int)");
  }
}

Assistant:

static inline char * Acb_Oper2Name( int i )
{
    if ( i == ABC_OPER_CONST_F  )  return "const0";
    if ( i == ABC_OPER_CONST_T  )  return "const1";
    if ( i == ABC_OPER_CONST_X  )  return "constX";
    if ( i == ABC_OPER_BIT_BUF  )  return "buf";
    if ( i == ABC_OPER_BIT_INV  )  return "not";
    if ( i == ABC_OPER_BIT_AND  )  return "and";
    if ( i == ABC_OPER_BIT_NAND )  return "nand";
    if ( i == ABC_OPER_BIT_OR   )  return "or";
    if ( i == ABC_OPER_BIT_NOR  )  return "nor";
    if ( i == ABC_OPER_BIT_XOR  )  return "xor";
    if ( i == ABC_OPER_BIT_NXOR )  return "xnor";
    if ( i == ABC_OPER_BIT_MUX )   return "mux";
    if ( i == ABC_OPER_TRI )       return "_DC";
    assert( 0 );
    return NULL;
}